

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockComparatorCopierTest_noActualCallForCustomTypeOutputParameter_TestShell::createTest
          (TEST_MockComparatorCopierTest_noActualCallForCustomTypeOutputParameter_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                                  ,0xb3);
  TEST_MockComparatorCopierTest_noActualCallForCustomTypeOutputParameter_Test::
  TEST_MockComparatorCopierTest_noActualCallForCustomTypeOutputParameter_Test
            ((TEST_MockComparatorCopierTest_noActualCallForCustomTypeOutputParameter_Test *)this_00)
  ;
  return this_00;
}

Assistant:

TEST(MockComparatorCopierTest, noActualCallForCustomTypeOutputParameter)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting expectedObject(1);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}